

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O0

int __thiscall Sound_Queue::init(Sound_Queue *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  sample_t *psVar2;
  SDL_sem *pSVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined1 in_DL;
  SDL_AudioSpec as;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 uVar6;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar7;
  int local_8;
  
  if (this->bufs != (sample_t *)0x0) {
    __assert_fail("!bufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/Sound_Queue.cpp"
                  ,0x41,"const char *Sound_Queue::init(long, int)");
  }
  psVar2 = (sample_t *)operator_new__(0x3000);
  this->bufs = psVar2;
  if (this->bufs == (sample_t *)0x0) {
    local_8 = 0x12057c;
  }
  else {
    pSVar3 = (SDL_sem *)SDL_CreateSemaphore(2);
    this->free_sem = pSVar3;
    if (this->free_sem == (SDL_sem *)0x0) {
      pcVar4 = sdl_error((char *)CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   CONCAT24(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0))));
      local_8 = (int)pcVar4;
    }
    else {
      uVar5 = SUB84(ctx,0);
      uVar6 = 0x8010;
      uVar7 = 0;
      iVar1 = SDL_OpenAudio(&stack0xffffffffffffffc0,0);
      if (iVar1 < 0) {
        pcVar4 = sdl_error((char *)CONCAT17(uVar7,CONCAT16(in_DL,CONCAT24(uVar6,uVar5))));
        local_8 = (int)pcVar4;
      }
      else {
        SDL_PauseAudio(0);
        this->sound_open = true;
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

const char* Sound_Queue::init( long sample_rate, int chan_count )
{
	assert( !bufs ); // can only be initialized once
	
	bufs = new sample_t [(long) buf_size * buf_count];
	if ( !bufs )
		return "Out of memory";
	
	free_sem = SDL_CreateSemaphore( buf_count - 1 );
	if ( !free_sem )
		return sdl_error( "Couldn't create semaphore" );
	
	SDL_AudioSpec as;
	as.freq = sample_rate;
	as.format = AUDIO_S16SYS;
	as.channels = chan_count;
	as.silence = 0;
	as.samples = buf_size;
	as.size = 0;
	as.callback = fill_buffer_;
	as.userdata = this;
	if ( SDL_OpenAudio( &as, NULL ) < 0 )
		return sdl_error( "Couldn't open SDL audio" );
	SDL_PauseAudio( false );
	sound_open = true;
	
	return NULL;
}